

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Common_Types chaiscript::Boxed_Number::get_common_type(size_t t_size,bool t_signed)

{
  undefined1 local_25;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  bool t_signed_local;
  size_t t_size_local;
  
  if ((t_size == 1) && (t_signed)) {
    local_10 = t_int8;
  }
  else {
    if (t_size == 1) {
      local_14 = t_uint8;
    }
    else {
      if ((t_size == 2) && (t_signed)) {
        local_18 = t_int16;
      }
      else {
        if (t_size == 2) {
          local_1c = t_uint16;
        }
        else {
          if ((t_size == 4) && (t_signed)) {
            local_20 = t_int32;
          }
          else {
            if (t_size == 4) {
              local_24 = t_uint32;
            }
            else {
              local_25 = 0;
              if (t_size == 8) {
                local_25 = t_signed;
              }
              local_24 = t_uint64;
              if ((local_25 & 1) != 0) {
                local_24 = t_int64;
              }
            }
            local_20 = local_24;
          }
          local_1c = local_20;
        }
        local_18 = local_1c;
      }
      local_14 = local_18;
    }
    local_10 = local_14;
  }
  return local_10;
}

Assistant:

get_common_type(size_t t_size, bool t_signed)
      {
        return   (t_size == 1 && t_signed)?(Common_Types::t_int8)
                :(t_size == 1)?(Common_Types::t_uint8)
                :(t_size == 2 && t_signed)?(Common_Types::t_int16)
                :(t_size == 2)?(Common_Types::t_uint16)
                :(t_size == 4 && t_signed)?(Common_Types::t_int32)
                :(t_size == 4)?(Common_Types::t_uint32)
                :(t_size == 8 && t_signed)?(Common_Types::t_int64)
                :(Common_Types::t_uint64);
      }